

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O2

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  void *pvVar5;
  float *pfVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  undefined1 (*pauVar18) [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  iVar11 = bottom_top_blob->elempack;
  iVar10 = bottom_top_blob->dims;
  iVar17 = bottom_top_blob->w;
  uVar9 = bottom_top_blob->h;
  if (iVar10 == 3) {
    iVar10 = iVar17 * iVar11 * uVar9;
    pp_Var3 = this->_vptr_PReLU_x86;
    uVar14 = 0;
    uVar15 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar15 = uVar14;
    }
    for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
      pfVar6 = *(float **)(&this->field_0xd8 + (long)pp_Var3[-3]);
      if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) < 2) {
        fVar20 = *pfVar6;
        fVar22 = fVar20;
        fVar23 = fVar20;
        fVar24 = fVar20;
        fVar25 = fVar20;
      }
      else {
        fVar20 = pfVar6[uVar14];
        fVar22 = fVar20;
        fVar23 = fVar20;
        fVar24 = fVar20;
        fVar25 = fVar20;
        if (iVar11 == 4) {
          pfVar6 = pfVar6 + uVar14 * 4;
          fVar22 = *pfVar6;
          fVar23 = pfVar6[1];
          fVar24 = pfVar6[2];
          fVar25 = pfVar6[3];
        }
      }
      pvVar5 = bottom_top_blob->data;
      sVar7 = bottom_top_blob->elemsize;
      sVar8 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [16])(sVar8 * uVar14 * sVar7 + (long)pvVar5);
      lVar12 = 0;
      for (iVar17 = 0; iVar17 + 3 < iVar10; iVar17 = iVar17 + 4) {
        auVar21 = maxps(*pauVar18,ZEXT816(0));
        auVar19 = minps(*pauVar18,ZEXT816(0));
        *(float *)*pauVar18 = auVar19._0_4_ * fVar22 + auVar21._0_4_;
        *(float *)(*pauVar18 + 4) = auVar19._4_4_ * fVar23 + auVar21._4_4_;
        *(float *)(*pauVar18 + 8) = auVar19._8_4_ * fVar24 + auVar21._8_4_;
        *(float *)(*pauVar18 + 0xc) = auVar19._12_4_ * fVar25 + auVar21._12_4_;
        pauVar18 = pauVar18 + 1;
        lVar12 = lVar12 + 4;
      }
      lVar13 = sVar8 * sVar7 * uVar14;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        fVar22 = *(float *)((long)pvVar5 + lVar12 * 4 + lVar13);
        if (fVar22 < 0.0) {
          *(float *)((long)pvVar5 + lVar12 * 4 + lVar13) = fVar22 * fVar20;
        }
      }
    }
  }
  else if (iVar10 == 2) {
    pp_Var3 = this->_vptr_PReLU_x86;
    uVar14 = 0;
    uVar15 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar15 = uVar14;
    }
    for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
      pfVar6 = *(float **)(&this->field_0xd8 + (long)pp_Var3[-3]);
      if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) < 2) {
        fVar20 = *pfVar6;
        fVar22 = fVar20;
        fVar23 = fVar20;
        fVar24 = fVar20;
        fVar25 = fVar20;
      }
      else {
        fVar20 = pfVar6[uVar14];
        fVar22 = fVar20;
        fVar23 = fVar20;
        fVar24 = fVar20;
        fVar25 = fVar20;
        if (iVar11 == 4) {
          pfVar6 = pfVar6 + uVar14 * 4;
          fVar22 = *pfVar6;
          fVar23 = pfVar6[1];
          fVar24 = pfVar6[2];
          fVar25 = pfVar6[3];
        }
      }
      pvVar5 = bottom_top_blob->data;
      sVar7 = bottom_top_blob->elemsize;
      iVar10 = bottom_top_blob->w;
      pauVar18 = (undefined1 (*) [16])(uVar14 * (long)iVar10 * sVar7 + (long)pvVar5);
      lVar12 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar17 * iVar11; iVar16 = iVar16 + 4) {
        auVar21 = maxps(*pauVar18,ZEXT816(0));
        auVar19 = minps(*pauVar18,ZEXT816(0));
        *(float *)*pauVar18 = auVar19._0_4_ * fVar22 + auVar21._0_4_;
        *(float *)(*pauVar18 + 4) = auVar19._4_4_ * fVar23 + auVar21._4_4_;
        *(float *)(*pauVar18 + 8) = auVar19._8_4_ * fVar24 + auVar21._8_4_;
        *(float *)(*pauVar18 + 0xc) = auVar19._12_4_ * fVar25 + auVar21._12_4_;
        pauVar18 = pauVar18 + 1;
        lVar12 = lVar12 + 4;
      }
      lVar13 = sVar7 * uVar14 * (long)iVar10;
      for (; (int)lVar12 < iVar17 * iVar11; lVar12 = lVar12 + 1) {
        fVar22 = *(float *)((long)pvVar5 + lVar12 * 4 + lVar13);
        if (fVar22 < 0.0) {
          *(float *)((long)pvVar5 + lVar12 * 4 + lVar13) = fVar22 * fVar20;
        }
      }
    }
  }
  else if (iVar10 == 1) {
    iVar11 = iVar11 * iVar17;
    pp_Var3 = this->_vptr_PReLU_x86;
    p_Var4 = pp_Var3[-3];
    pvVar5 = bottom_top_blob->data;
    pfVar6 = *(float **)(&this->field_0xd8 + (long)p_Var4);
    if (*(int *)(&this->field_0xd0 + (long)p_Var4) < 2) {
      fVar20 = *pfVar6;
      uVar9 = iVar11 / 4;
      lVar12 = 0;
      uVar15 = 0;
      if (0 < (int)uVar9) {
        uVar15 = (ulong)uVar9;
      }
      for (; uVar15 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        auVar21 = maxps(*(undefined1 (*) [16])((long)pvVar5 + lVar12),ZEXT816(0));
        auVar19 = minps(*(undefined1 (*) [16])((long)pvVar5 + lVar12),ZEXT816(0));
        pfVar6 = (float *)((long)pvVar5 + lVar12);
        *pfVar6 = auVar19._0_4_ * fVar20 + auVar21._0_4_;
        pfVar6[1] = auVar19._4_4_ * fVar20 + auVar21._4_4_;
        pfVar6[2] = auVar19._8_4_ * fVar20 + auVar21._8_4_;
        pfVar6[3] = auVar19._12_4_ * fVar20 + auVar21._12_4_;
      }
      for (lVar12 = (long)(int)(uVar9 << 2); lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar22 = *(float *)((long)pvVar5 + lVar12 * 4);
        if (fVar22 < 0.0) {
          *(float *)((long)pvVar5 + lVar12 * 4) = fVar22 * fVar20;
        }
      }
    }
    else {
      uVar9 = iVar11 / 4;
      lVar12 = 0;
      uVar15 = 0;
      if (0 < (int)uVar9) {
        uVar15 = (ulong)uVar9;
      }
      for (; uVar15 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        auVar19 = minps(*(undefined1 (*) [16])((long)pvVar5 + lVar12),ZEXT816(0));
        pfVar1 = (float *)((long)pfVar6 + lVar12);
        fVar20 = pfVar1[1];
        fVar22 = pfVar1[2];
        fVar23 = pfVar1[3];
        auVar21 = maxps(*(undefined1 (*) [16])((long)pvVar5 + lVar12),ZEXT816(0));
        pfVar2 = (float *)((long)pvVar5 + lVar12);
        *pfVar2 = auVar19._0_4_ * *pfVar1 + auVar21._0_4_;
        pfVar2[1] = auVar19._4_4_ * fVar20 + auVar21._4_4_;
        pfVar2[2] = auVar19._8_4_ * fVar22 + auVar21._8_4_;
        pfVar2[3] = auVar19._12_4_ * fVar23 + auVar21._12_4_;
      }
      for (lVar12 = (long)(int)(uVar9 << 2); lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar20 = *(float *)((long)pvVar5 + lVar12 * 4);
        if (fVar20 < 0.0) {
          *(float *)((long)pvVar5 + lVar12 * 4) =
               fVar20 * *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var3[-3]) + lVar12 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}